

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  Arena *arena;
  int iVar1;
  int iVar2;
  uint uVar3;
  RepeatedPtrFieldBase *pRVar4;
  Rep *pRVar5;
  long lVar6;
  undefined4 extraout_var;
  MessageLite *this_00;
  LogMessage *this_01;
  uint uVar7;
  RepeatedPtrFieldBase *unaff_RBX;
  int extend_amount;
  RepeatedPtrFieldBase *unaff_R12;
  MessageLite *unaff_R14;
  void **unaff_R15;
  string_view sVar8;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase local_48;
  
  if (from == this) {
    MergeFrom<google::protobuf::MessageLite>();
LAB_0046ef32:
    MergeFrom<google::protobuf::MessageLite>(&local_48);
LAB_0046ef3c:
    this = &local_48;
    MergeFrom<google::protobuf::MessageLite>(this);
  }
  else {
    uVar7 = from->current_size_;
    unaff_RBX = (RepeatedPtrFieldBase *)(ulong)uVar7;
    if ((int)uVar7 < 1) goto LAB_0046ef32;
    iVar2 = this->current_size_;
    uVar7 = uVar7 + iVar2;
    unaff_RBX = (RepeatedPtrFieldBase *)(ulong)uVar7;
    iVar1 = this->capacity_proxy_ + 1;
    extend_amount = uVar7 - iVar1;
    if (extend_amount == 0 || (int)uVar7 < iVar1) {
      pRVar4 = this;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar5 = rep(this);
        pRVar4 = (RepeatedPtrFieldBase *)pRVar5->elements;
        iVar2 = this->current_size_;
      }
      unaff_R15 = &pRVar4->tagged_rep_or_elem_ + iVar2;
    }
    else {
      unaff_R15 = InternalExtend(this,extend_amount);
    }
    unaff_R14 = (MessageLite *)from->tagged_rep_or_elem_;
    unaff_R12 = from;
    if (((ulong)unaff_R14 & 1) != 0) {
      pRVar5 = rep(from);
      unaff_R14 = (MessageLite *)pRVar5->elements[0];
      unaff_R12 = (RepeatedPtrFieldBase *)pRVar5->elements;
    }
    local_50 = this;
    if (unaff_R14 == (MessageLite *)0x0) goto LAB_0046ef3c;
    iVar2 = from->current_size_;
    local_48.arena_._4_4_ = uVar7;
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar7 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar5 = rep(this);
      uVar7 = pRVar5->allocated_size;
    }
    unaff_RBX = (RepeatedPtrFieldBase *)(&unaff_R12->tagged_rep_or_elem_ + iVar2);
    if ((int)uVar7 <= this->current_size_) goto LAB_0046ee1c;
  }
  iVar2 = MergeIntoClearedMessages(this,from);
  unaff_R15 = unaff_R15 + iVar2;
  unaff_R12 = (RepeatedPtrFieldBase *)(&unaff_R12->tagged_rep_or_elem_ + iVar2);
LAB_0046ee1c:
  if (unaff_R12 < unaff_RBX) {
    arena = local_50->arena_;
    do {
      if ((long *)unaff_R12->tagged_rep_or_elem_ == (long *)0x0) {
        MergeFrom<google::protobuf::MessageLite>(&local_48);
LAB_0046eec3:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                   ,0xf0,"TypeId::Get(**src) == TypeId::Get(*prototype)");
        sVar8 = MessageLite::GetTypeName((MessageLite *)unaff_R12->tagged_rep_or_elem_);
        this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            ((LogMessage *)&local_48,sVar8);
        sVar8._M_str = " vs ";
        sVar8._M_len = 4;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_01,sVar8);
        sVar8 = MessageLite::GetTypeName(unaff_R14);
        absl::lts_20250127::log_internal::LogMessage::operator<<(this_01,sVar8);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_48);
      }
      lVar6 = (**(code **)(*unaff_R12->tagged_rep_or_elem_ + 0x20))();
      iVar2 = (*unaff_R14->_vptr_MessageLite[4])(unaff_R14);
      if (lVar6 != CONCAT44(extraout_var,iVar2)) goto LAB_0046eec3;
      this_00 = MessageLite::New(unaff_R14,arena);
      *unaff_R15 = this_00;
      MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)unaff_R12->tagged_rep_or_elem_);
      unaff_R12 = (RepeatedPtrFieldBase *)&unaff_R12->current_size_;
      unaff_R15 = unaff_R15 + 1;
    } while (unaff_R12 < unaff_RBX);
  }
  uVar7 = local_48.arena_._4_4_;
  local_50->current_size_ = local_48.arena_._4_4_;
  if (((ulong)local_50->tagged_rep_or_elem_ & 1) == 0) {
    uVar3 = (uint)(local_50->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar5 = rep(local_50);
    uVar3 = pRVar5->allocated_size;
  }
  if ((int)uVar3 < (int)uVar7) {
    pRVar5 = rep(local_50);
    pRVar5->allocated_size = uVar7;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<MessageLite>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  ABSL_DCHECK(from.current_size_ > 0);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<MessageLite**>(InternalReserve(new_size));
  auto src = reinterpret_cast<MessageLite const* const*>(from.elements());
  auto end = src + from.current_size_;
  const MessageLite* prototype = src[0];
  ABSL_DCHECK(prototype != nullptr);
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  for (; src < end; ++src, ++dst) {
    ABSL_DCHECK(*src != nullptr);
    ABSL_DCHECK(TypeId::Get(**src) == TypeId::Get(*prototype))
        << (**src).GetTypeName() << " vs " << prototype->GetTypeName();
    *dst = prototype->New(arena);
    (*dst)->CheckTypeAndMergeFrom(**src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}